

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

int lest::run(tests *specification,int argc,char **argv,ostream *os)

{
  int iVar1;
  vector<lest::test,_std::allocator<lest::test>_> *in_RDX;
  undefined4 in_ESI;
  ostream *in_stack_00000338;
  texts *in_stack_00000340;
  tests *in_stack_00000348;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  char **in_stack_ffffffffffffffa8;
  vector<lest::test,_std::allocator<lest::test>_> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_fffffffffffffff0;
  
  std::vector<lest::test,_std::allocator<lest::test>_>::vector
            ((vector<lest::test,_std::allocator<lest::test>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  make_texts_abi_cxx11_
            (in_stack_ffffffffffffffa8,
             (char **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  iVar1 = run(in_stack_00000348,in_stack_00000340,in_stack_00000338);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffffb0);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(in_stack_ffffffffffffffb0);
  return iVar1;
}

Assistant:

inline int run( tests const & specification, int argc, char ** argv, std::ostream & os = std::cout )
{
    return run( specification, make_texts( argv + 1, argv + argc ), os  );
}